

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::FreezeImpl
          (PathTypeHandlerBase *this,DynamicObject *instance,bool isConvertedType)

{
  DynamicObject *instance_00;
  bool bVar1;
  BOOL BVar2;
  ScriptContext *pSVar3;
  DictionaryTypeHandler *this_00;
  PropertyRecord *operationInternalPropertyRecord;
  DynamicObject *pDStack_20;
  bool isConvertedType_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSVar3 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar3->convertPathToDictionaryExtensionsCount =
       pSVar3->convertPathToDictionaryExtensionsCount + 1;
  bVar1 = DynamicObject::HasObjectArray(pDStack_20);
  if ((!bVar1) && (bVar1 = CanConvertToSimpleDictionaryType(this), instance_00 = pDStack_20, bVar1))
  {
    operationInternalPropertyRecord =
         BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                   ((BuiltInPropertyRecord *)InternalPropertyRecords::FrozenType);
    BVar2 = ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation<Js::PathTypeHandlerBase::FreezeImpl(Js::DynamicObject*,bool)::__0>
                      (this,instance_00,operationInternalPropertyRecord,
                       (anon_class_8_1_0902ba13)&stack0xffffffffffffffe0);
    return BVar2;
  }
  this_00 = ConvertToDictionaryType(this,pDStack_20);
  BVar2 = DynamicTypeHandler::Freeze(&this_00->super_DynamicTypeHandler,pDStack_20,isConvertedType);
  return BVar2;
}

Assistant:

BOOL PathTypeHandlerBase::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryExtensionsCount++;
#endif
        // See the comment inside Seal WRT HasObjectArray branch.
        if (instance->HasObjectArray() || !this->CanConvertToSimpleDictionaryType())
        {
            return this->ConvertToDictionaryType(instance)->Freeze(instance, isConvertedType);
        }
        else
        {
            return this->ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation(instance, InternalPropertyRecords::FrozenType,
                [&](SimpleDictionaryTypeHandlerWithNonExtensibleSupport* newTypeHandler)
                {
                    return newTypeHandler->FreezeInternal(instance, true);  // true: we don't want to change type in FreezeInternal.
                });
        }
    }